

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int8_suite::test_zero(void)

{
  undefined4 local_70;
  value local_6c [2];
  undefined4 local_64;
  type local_5e [2];
  undefined4 local_5c;
  value local_58 [2];
  undefined4 local_50;
  value local_4c [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [2];
  
  decoder.current.view._M_str._6_2_ = 0xa0;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>
            ((decoder *)local_38,(uchar (*) [2])((long)&decoder.current.view._M_str + 6));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa2,"void int8_suite::test_zero()",local_40,&local_44);
  local_4c[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_38);
  local_50 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa3,"void int8_suite::test_zero()",local_4c,&local_50);
  local_58[0] = trial::protocol::bintoken::detail::decoder::category((decoder *)local_38);
  local_5c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa4,"void int8_suite::test_zero()",local_58,&local_5c);
  local_5e[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int8>((decoder *)local_38);
  local_64 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,int>
            ("decoder.value<token::int8>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa5,"void int8_suite::test_zero()",local_5e,&local_64);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_6c[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_70 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xa7,"void int8_suite::test_zero()",local_6c,&local_70);
  return;
}

Assistant:

void test_zero()
{
    const value_type input[] = { token::code::int8, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int8>(), 0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}